

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

bool __thiscall flow::lang::Lexer::consumeSpace(Lexer *this)

{
  long *plVar1;
  FILE *__s;
  int iVar2;
  uint uVar3;
  bool bVar4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  string line;
  pointer local_288;
  size_type sStack_280;
  ulong local_278;
  ulong local_268;
  ulong local_258;
  string local_248;
  undefined1 local_228 [504];
  
  uVar3 = this->currentChar_;
  bVar4 = uVar3 == 0xffffffff;
  if (!bVar4) {
    while (plVar1 = (long *)(this->contexts_).
                            super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next,
          (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) == 0) {
      iVar2 = isspace(uVar3);
      if (iVar2 == 0) {
        iVar2 = isprint(uVar3);
        __s = _stdout;
        if (iVar2 != 0) {
          if (bVar4) {
            return false;
          }
          plVar1 = (long *)(this->contexts_).
                           super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next;
          if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0) {
            return false;
          }
          if (uVar3 == 0x2f) {
            iVar2 = std::istream::peek();
            if (iVar2 != 0x2a) {
              return true;
            }
            do {
              nextChar(this,true);
              if ((this->currentChar_ == -1) ||
                 (plVar1 = (long *)(this->contexts_).
                                   super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4].
                                   _M_next,
                 (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0)) {
                this->token_ = Eof;
                return false;
              }
            } while ((this->currentChar_ != 0x2a) || (iVar2 = std::istream::peek(), iVar2 != 0x2f));
            nextChar(this,true);
            nextChar(this,true);
            bVar4 = consumeSpace(this);
            return bVar4;
          }
          if (uVar3 != 0x23) {
            return true;
          }
          iVar2 = *(int *)((long)((this->contexts_).
                                  super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                                  ._M_impl._M_node.super__List_node_base._M_next[1]._M_next + 4) +
                          0xc);
          local_248._M_string_length = 0;
          local_248.field_2._M_allocated_capacity =
               local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          nextChar(this,true);
          goto LAB_0013a830;
        }
        local_278 = (ulong)(this->location_).end.line;
        local_268 = (ulong)(this->location_).end.column;
        local_258 = (ulong)(uVar3 & 0xff);
        local_288 = (this->location_).filename._M_dataplus._M_p;
        sStack_280 = (this->location_).filename._M_string_length;
        local_248.field_2._M_allocated_capacity = 0;
        local_248._M_dataplus._M_p = (pointer)&PTR_grow_001aeda8;
        local_248.field_2._8_8_ = 500;
        format_str.size_ = 0x1b;
        format_str.data_ = "{}[{}:{}]: invalid byte {}\n";
        args.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_288;
        args.types_ = 0x255b;
        local_248._M_string_length = (size_type)local_228;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_248,format_str,args);
        fwrite((void *)local_248._M_string_length,1,local_248.field_2._M_allocated_capacity,__s);
        local_248._M_dataplus._M_p = (pointer)&PTR_grow_001aeda8;
        if ((undefined1 *)local_248._M_string_length != local_228) {
          operator_delete((void *)local_248._M_string_length,local_248.field_2._8_8_);
        }
      }
      nextChar(this,true);
      uVar3 = this->currentChar_;
      bVar4 = uVar3 == 0xffffffff;
      if (bVar4) {
        return false;
      }
    }
  }
  return false;
LAB_0013a830:
  if ((this->currentChar_ == -1) ||
     (plVar1 = (long *)(this->contexts_).
                       super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next,
     (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0)) {
    this->token_ = Eof;
    if (iVar2 == 1) {
      processCommand(this,&local_248);
    }
    bVar4 = this->token_ != Eof;
LAB_0013a962:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    return bVar4;
  }
  if (this->currentChar_ == 10) {
    if (iVar2 == 1) {
      processCommand(this,&local_248);
    }
    bVar4 = consumeSpace(this);
    goto LAB_0013a962;
  }
  std::__cxx11::string::push_back((char)&local_248);
  nextChar(this,true);
  goto LAB_0013a830;
}

Assistant:

bool Lexer::eof() const {
  return currentChar_ == EOF || scope()->stream->eof();
}